

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O1

void btree_update_meta(btree *btree,btree_meta *meta)

{
  bnode *__dest;
  ushort uVar1;
  void *pvVar2;
  ushort uVar3;
  int iVar4;
  bnode *pbVar5;
  size_t sVar6;
  bnode *pbVar7;
  ushort uVar8;
  ulong uVar9;
  ulong uVar10;
  
  pbVar5 = (bnode *)(*btree->blk_ops->blk_read)(btree->blk_handle,btree->root_bid);
  uVar1 = pbVar5->flag;
  __dest = pbVar5 + 1;
  pbVar7 = __dest;
  if ((uVar1 & 2) != 0) {
    pbVar7 = (bnode *)((long)&__dest->kvsize +
                      (ulong)((ushort)(__dest->kvsize << 8 | __dest->kvsize >> 8) + 0x11 &
                             0xfffffff0));
  }
  (pbVar5->field_4).data = pbVar7;
  uVar8 = 0xffff;
  if ((uVar1 & 2) != 0) {
    uVar8 = __dest->kvsize << 8 | __dest->kvsize >> 8;
  }
  if (meta == (btree_meta *)0x0) {
    if ((uVar1 & 2) != 0) {
      pvVar2 = (pbVar5->field_4).data;
      sVar6 = (*btree->kv_ops->get_data_size)(pbVar5,(void *)0x0,(void *)0x0,(void *)0x0,0);
      memmove(__dest,pvVar2,sVar6);
      (pbVar5->field_4).data =
           (void *)((long)(pbVar5->field_4).data - (ulong)(uVar8 + 0x11 & 0xfffffff0));
      *(byte *)&pbVar5->flag = (byte)pbVar5->flag & 0xfd;
    }
  }
  else {
    uVar1 = meta->size;
    if (uVar8 < uVar1) {
      fdb_assert_die("metasize <= old_metasize",
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/btree.cc"
                     ,0x127,(ulong)uVar1,(ulong)uVar8);
    }
    if (meta->size == 0) {
      uVar3 = pbVar5->flag & 0xfffd;
    }
    else {
      pbVar5[1].kvsize = uVar1 << 8 | uVar1 >> 8;
      memcpy(&pbVar5[1].flag,meta->data,(ulong)uVar1);
      uVar3 = pbVar5->flag | 2;
    }
    pbVar5->flag = uVar3;
    uVar10 = (ulong)(uVar1 + 0x11 & 0xfffffff0);
    uVar9 = (ulong)(uVar8 + 0x11 & 0xfffffff0);
    if (uVar10 - 2 < uVar9 - 2) {
      pvVar2 = (pbVar5->field_4).data;
      sVar6 = (*btree->kv_ops->get_data_size)(pbVar5,(void *)0x0,(void *)0x0,(void *)0x0,0);
      memmove((void *)((long)&pbVar5[1].kvsize + uVar10),pvVar2,sVar6);
      (pbVar5->field_4).data = (void *)((long)(pbVar5->field_4).data + (uVar10 - uVar9));
    }
  }
  iVar4 = (*btree->blk_ops->blk_is_writable)(btree->blk_handle,btree->root_bid);
  if (iVar4 != 0) {
    (*btree->blk_ops->blk_set_dirty)(btree->blk_handle,btree->root_bid);
    return;
  }
  (*btree->blk_ops->blk_move)(btree->blk_handle,btree->root_bid,&btree->root_bid);
  return;
}

Assistant:

void btree_update_meta(struct btree *btree, struct btree_meta *meta)
{
    void *addr;
    void *ptr;
    metasize_t metasize, _metasize;
    metasize_t old_metasize = (metasize_t)(-1);
    struct bnode *node;

    // read root node
    addr = btree->blk_ops->blk_read(btree->blk_handle, btree->root_bid);
    node = _fetch_bnode(btree, addr, btree->height);

    ptr = ((uint8_t *)node) + sizeof(struct bnode);

    if (node->flag & BNODE_MASK_METADATA) {
        memcpy(&old_metasize, ptr, sizeof(metasize_t));
        old_metasize = _endian_decode(old_metasize);
    }

    if (meta) {
        metasize = meta->size;

        // new meta size cannot be larger than old meta size
        fdb_assert(metasize <= old_metasize, metasize, old_metasize);
        (void)metasize;

        // overwrite
        if (meta->size > 0) {
            _metasize = _endian_encode(metasize);
            memcpy(ptr, &_metasize, sizeof(metasize_t));
            memcpy((uint8_t *)ptr + sizeof(metasize_t), meta->data, metasize);
            node->flag |= BNODE_MASK_METADATA;
        }else{
            // clear the flag
            node->flag &= ~BNODE_MASK_METADATA;
        }
        // move kv-pairs (only if meta size is changed)
        if (_metasize_align(metasize) < _metasize_align(old_metasize)){
            memmove(
                (uint8_t *)ptr + sizeof(metasize_t) + _metasize_align(metasize),
                node->data,
                btree->kv_ops->get_data_size(node, NULL, NULL, NULL, 0));
            node->data = (uint8_t *)node->data - (_metasize_align(old_metasize) -
                         _metasize_align(metasize));
        }

    }else {
        if (node->flag & BNODE_MASK_METADATA) {
            // existing metadata is removed
            memmove(ptr, node->data, btree->kv_ops->get_data_size(node,
                                                    NULL, NULL, NULL, 0));
            node->data = (uint8_t *)node->data - (_metasize_align(old_metasize) +
                         sizeof(metasize_t));
            // clear the flag
            node->flag &= ~BNODE_MASK_METADATA;
        }
    }

    if (!btree->blk_ops->blk_is_writable(btree->blk_handle, btree->root_bid)) {
        // already flushed block -> cannot overwrite, we have to move to new block
        btree->blk_ops->blk_move(btree->blk_handle, btree->root_bid,
                                &btree->root_bid);
    }else{
        btree->blk_ops->blk_set_dirty(btree->blk_handle, btree->root_bid);
    }
}